

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMReadWriteGraphBuilder.cpp
# Opt level: O0

vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
* __thiscall
dg::dda::LLVMReadWriteGraphBuilder::mapPointers
          (LLVMReadWriteGraphBuilder *this,Value *where,Value *val,Offset size)

{
  Offset OVar1;
  bool bVar2;
  int iVar3;
  RWNode *os;
  Value *in_RCX;
  Value *in_RDX;
  Value *in_RSI;
  set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
  *in_RDI;
  LLVMReadWriteGraphBuilder *in_R8;
  undefined1 auVar4 [16];
  pair<std::_Rb_tree_const_iterator<const_llvm::Value_*>,_bool> pVar5;
  RWNode *ptrNode;
  LLVMPointer *ptr;
  const_iterator __end2;
  const_iterator __begin2;
  LLVMPointsToSet *__range2;
  pair<bool,_dg::LLVMPointsToSet> psn;
  vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  *result;
  LLVMPointsToSet *in_stack_ffffffffffffff08;
  raw_ostream *in_stack_ffffffffffffff10;
  raw_ostream *in_stack_ffffffffffffff18;
  raw_ostream *in_stack_ffffffffffffff20;
  set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
  *this_00;
  Offset in_stack_ffffffffffffff40;
  ValInfo local_b8;
  ValInfo local_b0;
  ValInfo local_a8;
  _Base_ptr local_a0;
  undefined1 local_98;
  _Base_ptr local_90;
  undefined1 uVar6;
  undefined7 in_stack_ffffffffffffff79;
  undefined1 local_78 [16];
  undefined8 *local_68;
  LLVMPointsToSetImpl *local_60;
  LLVMPointsToSetImpl *local_58;
  undefined1 *local_50;
  undefined4 local_44;
  byte local_40 [8];
  undefined1 auStack_38 [15];
  byte local_29;
  Value *local_28;
  Value *local_20;
  LLVMReadWriteGraphBuilder *local_10;
  
  local_29 = 0;
  this_00 = in_RDI;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_10 = in_R8;
  std::
  vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  ::vector((vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
            *)0x186cb6);
  (**(code **)(**(long **)(in_RSI + 0xd8) + 0x10))(local_40,*(long **)(in_RSI + 0xd8),local_28);
  if ((local_40[0] & 1) == 0) {
    std::
    vector<dg::dda::GenericDefSite<dg::dda::RWNode>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
    ::emplace_back<dg::dda::RWNode*&>
              ((vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                *)in_stack_ffffffffffffff20,(RWNode **)in_stack_ffffffffffffff18);
  }
  else {
    bVar2 = LLVMPointsToSet::empty((LLVMPointsToSet *)0x186d1c);
    if (bVar2) {
      std::
      vector<dg::dda::GenericDefSite<dg::dda::RWNode>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
      ::emplace_back<dg::dda::RWNode*&>
                ((vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                  *)in_stack_ffffffffffffff20,(RWNode **)in_stack_ffffffffffffff18);
    }
    else {
      LLVMPointsToSet::size((LLVMPointsToSet *)0x186d5c);
      std::
      vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
      ::reserve((vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                 *)in_stack_ffffffffffffff40.offset,(size_type)in_RSI);
      bVar2 = LLVMPointsToSet::hasUnknown((LLVMPointsToSet *)0x186d7a);
      if (bVar2) {
        std::
        vector<dg::dda::GenericDefSite<dg::dda::RWNode>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
        ::emplace_back<dg::dda::RWNode*&>
                  ((vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                    *)in_stack_ffffffffffffff20,(RWNode **)in_stack_ffffffffffffff18);
      }
      local_50 = auStack_38;
      local_58 = (LLVMPointsToSetImpl *)LLVMPointsToSet::begin(in_stack_ffffffffffffff08);
      local_60 = (LLVMPointsToSetImpl *)LLVMPointsToSet::end();
      while( true ) {
        bVar2 = LLVMPointsToSet::const_iterator::operator!=
                          ((const_iterator *)in_stack_ffffffffffffff10,
                           (const_iterator *)in_stack_ffffffffffffff08);
        if (!bVar2) break;
        auVar4 = LLVMPointsToSet::const_iterator::operator*((const_iterator *)0x186df2);
        local_68 = (undefined8 *)local_78;
        local_78 = auVar4;
        bVar2 = llvm::isa<llvm::Function,llvm::Value*>((Value **)0x186e1f);
        if (!bVar2) {
          os = getOperand((LLVMReadWriteGraphBuilder *)in_stack_ffffffffffffff40.offset,in_RSI);
          if (os == (RWNode *)0x0) {
            if (mapPointers(llvm::Value_const*,llvm::Value_const*,dg::Offset)::warned == '\0') {
              iVar3 = __cxa_guard_acquire(&mapPointers(llvm::Value_const*,llvm::Value_const*,dg::Offset)
                                           ::warned);
              if (iVar3 != 0) {
                std::
                set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                ::set((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                       *)0x186e76);
                __cxa_atexit(std::
                             set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                             ::~set,&mapPointers::warned,&__dso_handle);
                __cxa_guard_release(&mapPointers(llvm::Value_const*,llvm::Value_const*,dg::Offset)::
                                     warned);
              }
            }
            pVar5 = std::
                    set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                    ::insert(this_00,(value_type *)in_RDI);
            local_a0 = (_Base_ptr)pVar5.first._M_node;
            local_98 = pVar5.second;
            local_90 = local_a0;
            if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              uVar6 = local_98;
              llvm::errs();
              in_stack_ffffffffffffff10 =
                   llvm::raw_ostream::operator<<
                             (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
              ValInfo::ValInfo(&local_a8,local_20);
              operator<<((raw_ostream *)os,(ValInfo *)CONCAT71(in_stack_ffffffffffffff79,uVar6));
              llvm::raw_ostream::operator<<
                        (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
              llvm::errs();
              in_stack_ffffffffffffff18 =
                   llvm::raw_ostream::operator<<
                             (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
              ValInfo::ValInfo(&local_b0,local_28);
              operator<<((raw_ostream *)os,(ValInfo *)CONCAT71(in_stack_ffffffffffffff79,uVar6));
              llvm::raw_ostream::operator<<
                        (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
              llvm::errs();
              in_stack_ffffffffffffff20 =
                   llvm::raw_ostream::operator<<
                             (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
              ValInfo::ValInfo(&local_b8,(Value *)*local_68);
              operator<<((raw_ostream *)os,(ValInfo *)CONCAT71(in_stack_ffffffffffffff79,uVar6));
              llvm::raw_ostream::operator<<
                        (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
            }
          }
          else {
            in_stack_ffffffffffffff08 = (LLVMPointsToSet *)(local_68 + 1);
            bVar2 = Offset::isUnknown((Offset *)(local_68 + 1));
            OVar1.offset = (type)local_10;
            if (bVar2) {
              Offset::Offset((Offset *)&stack0xffffffffffffff40,Offset::UNKNOWN);
              OVar1.offset = in_stack_ffffffffffffff40.offset;
            }
            in_stack_ffffffffffffff40.offset = OVar1.offset;
            std::
            vector<dg::dda::GenericDefSite<dg::dda::RWNode>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
            ::emplace_back<dg::dda::RWNode*&,dg::Offset_const&,dg::Offset>
                      ((vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                        *)this_00,(RWNode **)in_RDI,(Offset *)in_stack_ffffffffffffff20,
                       (Offset *)in_stack_ffffffffffffff18);
          }
        }
        LLVMPointsToSet::const_iterator::operator++((const_iterator *)in_stack_ffffffffffffff10);
      }
    }
  }
  local_29 = 1;
  local_44 = 1;
  std::pair<bool,_dg::LLVMPointsToSet>::~pair((pair<bool,_dg::LLVMPointsToSet> *)0x18704a);
  if ((local_29 & 1) == 0) {
    std::
    vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
    ::~vector((vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
               *)in_stack_ffffffffffffff20);
  }
  return (vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
          *)this_00;
}

Assistant:

std::vector<DefSite>
LLVMReadWriteGraphBuilder::mapPointers(const llvm::Value *where,
                                       const llvm::Value *val, Offset size) {
    std::vector<DefSite> result;

    auto psn = PTA->getLLVMPointsToChecked(val);
    if (!psn.first) {
        result.emplace_back(UNKNOWN_MEMORY);
#ifndef NDEBUG
        llvm::errs() << "[RWG] warning at: " << ValInfo(where) << "\n";
        llvm::errs() << "No points-to set for: " << ValInfo(val) << "\n";
#endif
        // don't have points-to information for used pointer
        return result;
    }

    if (psn.second.empty()) {
#ifndef NDEBUG
        llvm::errs() << "[RWG] warning at: " << ValInfo(where) << "\n";
        llvm::errs() << "Empty points-to set for: " << ValInfo(val) << "\n";
#endif
        // this may happen on invalid reads and writes to memory,
        // like when you try for example this:
        //
        //   int p, q;
        //   memcpy(p, q, sizeof p);
        //
        // (there should be &p and &q)
        // NOTE: maybe this is a bit strong to say unknown memory,
        // but better be sound then incorrect
        result.emplace_back(UNKNOWN_MEMORY);
        return result;
    }

    result.reserve(psn.second.size());

    if (psn.second.hasUnknown()) {
        result.emplace_back(UNKNOWN_MEMORY);
    }

    for (const auto &ptr : psn.second) {
        if (llvm::isa<llvm::Function>(ptr.value))
            continue;

        RWNode *ptrNode = getOperand(ptr.value);
        if (!ptrNode) {
            // keeping such set is faster then printing it all to terminal
            // ... and we don't flood the terminal that way
            static std::set<const llvm::Value *> warned;
            if (warned.insert(ptr.value).second) {
                llvm::errs() << "[RWG] error at " << ValInfo(where) << "\n";
                llvm::errs() << "[RWG] error for " << ValInfo(val) << "\n";
                llvm::errs() << "[RWG] error: Cannot find node for "
                             << ValInfo(ptr.value) << "\n";
            }
            continue;
        }

        // FIXME: we should pass just size to the DefSite ctor, but the old code
        // relies on the behavior that when offset is unknown, the length is
        // also unknown. So for now, mimic the old code. Remove it once we fix
        // the old code.
        result.emplace_back(ptrNode, ptr.offset,
                            ptr.offset.isUnknown() ? Offset::UNKNOWN : size);
    }

    return result;
}